

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O1

void StrToNumVectorHelper<std::vector<float,std::allocator<float>>>
               (string *source,vector<float,_std::allocator<float>_> *dest,value_type_conflict7 *def
               )

{
  iterator iVar1;
  istream *piVar2;
  string item;
  stringstream ss;
  float local_1dc;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  long local_1d0;
  char local_1c8 [16];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  if (*(long *)(dest + 8) != *(long *)dest) {
    *(long *)(dest + 8) = *(long *)dest;
  }
  if (source->_M_string_length == 0) {
    iVar1._M_current = *(float **)(dest + 8);
    if (iVar1._M_current == *(float **)(dest + 0x10)) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)dest,iVar1,def);
      return;
    }
    *iVar1._M_current = *def;
    *(float **)(dest + 8) = iVar1._M_current + 1;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8,(string *)source,_S_out|_S_in);
    local_1d0 = 0;
    local_1c8[0] = '\0';
    local_1d8._M_current = local_1c8;
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b8,(string *)&local_1d8,',');
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      local_1dc = (float)CONCAT31(local_1dc._1_3_,0x20);
      std::
      __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                (local_1d8,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(local_1d8._M_current + local_1d0),(_Iter_equals_val<const_char>)&local_1dc);
      local_1dc = strtof(local_1d8._M_current,(char **)0x0);
      iVar1._M_current = *(float **)(dest + 8);
      if (iVar1._M_current == *(float **)(dest + 0x10)) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(dest,iVar1,&local_1dc);
      }
      else {
        *iVar1._M_current = local_1dc;
        *(float **)(dest + 8) = iVar1._M_current + 1;
      }
    }
    iVar1._M_current = *(float **)(dest + 8);
    if (*(float **)dest == iVar1._M_current) {
      if (iVar1._M_current == *(float **)(dest + 0x10)) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)dest,iVar1,def);
      }
      else {
        *iVar1._M_current = *def;
        *(float **)(dest + 8) = iVar1._M_current + 1;
      }
    }
    if (local_1d8._M_current != local_1c8) {
      operator_delete(local_1d8._M_current);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

inline void StrToNumVectorHelper(const std::string &source, TList &dest, const typename TList::value_type &def)
{
    typedef typename TList::value_type T;
    dest.clear();

    if(!source.empty())
    {
        std::stringstream ss(source);
        std::string item;
        while(std::getline(ss, item, ','))
        {
            auto remove_ret = std::remove(item.begin(), item.end(), ' '); //-V530
            (void)remove_ret;

            try
            {
                if(std::is_same<T, int>::value ||
                   std::is_same<T, long>::value ||
                   std::is_same<T, short>::value)
                    dest.push_back(static_cast<T>(std::strtol(item.c_str(), NULL, 0)));
                else if(std::is_same<T, unsigned int>::value ||
                        std::is_same<T, unsigned long>::value ||
                        std::is_same<T, unsigned short>::value)
                    dest.push_back(static_cast<T>(std::strtoul(item.c_str(), NULL, 0)));
                else if(std::is_same<T, float>::value)
                    dest.push_back(std::strtof(item.c_str(), NULL));
                else
                    dest.push_back(std::strtod(item.c_str(), NULL));
            }
            catch(...)
            {
                dest.pop_back();
            }
        }

        if(dest.empty())
            dest.push_back(def);
    }
    else
        dest.push_back(def);
}